

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall CServerBrowser::AddFavorite(CServerBrowser *this,CServerInfo *pInfo)

{
  bool bVar1;
  CServerEntry *pCVar2;
  bool bVar3;
  uint ServerlistType;
  
  ServerlistType = 0;
  bVar1 = CServerBrowserFavorites::AddFavoriteEx
                    (&this->m_ServerBrowserFavorites,pInfo->m_aHostname,&pInfo->m_NetAddr,true,
                     (char *)0x0);
  if (bVar1) {
    bVar1 = true;
    do {
      bVar3 = bVar1;
      pCVar2 = Find(this,ServerlistType,&pInfo->m_NetAddr);
      if ((pCVar2 != (CServerEntry *)0x0) &&
         ((pCVar2->m_Info).m_Favorite = true, ServerlistType == this->m_ActServerlistType)) {
        CServerBrowserFilter::Sort
                  (&this->m_ServerBrowserFilter,this->m_aServerlist[ServerlistType].m_ppServerlist,
                   this->m_aServerlist[ServerlistType].m_NumServers,2);
      }
      ServerlistType = 1;
      bVar1 = false;
    } while (bVar3);
  }
  return;
}

Assistant:

void CServerBrowser::AddFavorite(const CServerInfo *pInfo)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pInfo->m_aHostname, &pInfo->m_NetAddr, true))
	{
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, pInfo->m_NetAddr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}